

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

_Bool do_constant_folding_cond_64(uint64_t x,uint64_t y,TCGCond c)

{
  TCGCond c_local;
  uint64_t y_local;
  uint64_t x_local;
  
  switch(c) {
  case TCG_COND_LT:
    x_local._7_1_ = (long)x < (long)y;
    break;
  case TCG_COND_GE:
    x_local._7_1_ = (long)y <= (long)x;
    break;
  case TCG_COND_LTU:
    x_local._7_1_ = x < y;
    break;
  case TCG_COND_GEU:
    x_local._7_1_ = y <= x;
    break;
  default:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/optimize.c"
            ,0x1df);
    abort();
  case TCG_COND_EQ:
    x_local._7_1_ = x == y;
    break;
  case TCG_COND_NE:
    x_local._7_1_ = x != y;
    break;
  case TCG_COND_LE:
    x_local._7_1_ = (long)x <= (long)y;
    break;
  case TCG_COND_GT:
    x_local._7_1_ = (long)y < (long)x;
    break;
  case TCG_COND_LEU:
    x_local._7_1_ = x <= y;
    break;
  case TCG_COND_GTU:
    x_local._7_1_ = y < x;
  }
  return x_local._7_1_;
}

Assistant:

static bool do_constant_folding_cond_64(uint64_t x, uint64_t y, TCGCond c)
{
    switch (c) {
    case TCG_COND_EQ:
        return x == y;
    case TCG_COND_NE:
        return x != y;
    case TCG_COND_LT:
        return (int64_t)x < (int64_t)y;
    case TCG_COND_GE:
        return (int64_t)x >= (int64_t)y;
    case TCG_COND_LE:
        return (int64_t)x <= (int64_t)y;
    case TCG_COND_GT:
        return (int64_t)x > (int64_t)y;
    case TCG_COND_LTU:
        return x < y;
    case TCG_COND_GEU:
        return x >= y;
    case TCG_COND_LEU:
        return x <= y;
    case TCG_COND_GTU:
        return x > y;
    default:
        tcg_abort();
    }
}